

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O3

void raster_size(char *fn,int *x,int *y,int *a)

{
  ulong uVar1;
  float fVar2;
  disp_vect_t dVar3;
  char cVar4;
  int iVar5;
  byte *__s2;
  disp_field512_t *padVar6;
  disp_field512_t *padVar7;
  long lVar8;
  undefined1 auVar9 [16];
  size_t sVar10;
  uint uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  ssize_t sVar15;
  int *piVar16;
  qnode_ptr_t p;
  qnode_ptr_t p_00;
  void *pvVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  int extraout_EDX;
  undefined4 *extraout_RDX;
  void *__dest;
  uint *puVar21;
  size_t sVar22;
  size_t sVar23;
  int iVar24;
  int *unaff_RBX;
  byte bVar25;
  int iVar26;
  undefined4 *unaff_RBP;
  undefined4 *__buf;
  byte *pbVar27;
  char *__src;
  long lVar28;
  long lVar29;
  uint *in_R8;
  int iVar30;
  uint *in_R9;
  uint uVar31;
  long lVar32;
  undefined4 *unaff_R14;
  uint *unaff_R15;
  bool bVar33;
  float fVar34;
  float fVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  float fVar44;
  float fVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined4 *unaff_retaddr;
  raster_t hd;
  int *in_stack_00000028;
  undefined8 in_stack_00000030;
  uint *in_stack_00000038;
  undefined4 *in_stack_00000040;
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  int iStack_2fc;
  float fStack_268;
  float fStack_264;
  char acStack_1f8 [92];
  int iStack_19c;
  uint *puStack_198;
  uint *puStack_190;
  char acStack_188 [88];
  void *pvStack_130;
  char acStack_128 [80];
  int aiStack_d8 [22];
  int *piStack_80;
  uint *puStack_48;
  undefined4 local_40;
  int local_3c;
  int local_38;
  undefined4 uStack_34;
  int *piStack_30;
  int *piStack_28;
  
  iVar13 = 0;
  uVar11 = open(fn,0);
  if ((int)uVar11 < 1) {
    raster_size_cold_1();
LAB_00104194:
    raster_size_cold_2();
  }
  else {
    __buf = &local_40;
    fn = (char *)(ulong)uVar11;
    sVar15 = read(uVar11,__buf,0x20);
    iVar13 = (int)__buf;
    if (sVar15 != 0x20) goto LAB_00104194;
    *x = local_3c;
    *y = local_38;
    iVar14 = local_38;
    if (local_38 < *x) {
      iVar14 = *x;
    }
    iVar26 = 0x200;
    if (((iVar14 - 0x101U < 0x100) || (iVar26 = 0x100, iVar14 - 0x81U < 0x80)) ||
       (iVar26 = 0x80, iVar14 - 0x41U < 0x40)) {
      *a = iVar26;
      close(uVar11);
      return;
    }
  }
  raster_size_cold_3();
  if (iVar13 < (int)fn) {
    iVar13 = (int)fn;
  }
  uVar12 = 0x200;
  if (iVar13 - 0x101U < 0x100) {
LAB_001041d6:
    *extraout_RDX = uVar12;
    return;
  }
  pvVar17 = (void *)(ulong)(iVar13 - 0x81U);
  uVar12 = 0x100;
  if (iVar13 - 0x81U < 0x80) goto LAB_001041d6;
  pbVar27 = (byte *)(ulong)(iVar13 - 0x41U);
  uVar12 = 0x80;
  if (iVar13 - 0x41U < 0x40) goto LAB_001041d6;
  binary_size_cold_1();
  uVar11 = (uint)fn;
  pvStack_130 = pvVar17;
  piStack_80 = a;
  if (uVar11 == 1) {
LAB_0010505a:
    usage();
  }
  if (uVar11 - 4 < 0x15) {
    fn = (char *)CONCAT44(uStack_34,local_38);
    *in_stack_00000040 = 0;
    *piStack_30 = 1;
    *piStack_28 = 1;
    *unaff_RBX = 0;
    *unaff_R14 = 2;
    *puStack_48 = 1;
    *(int *)fn = 0;
    *unaff_R15 = 3;
    *unaff_retaddr = 0;
    *in_stack_00000028 = 0;
    *in_stack_00000038 = 10;
    *(undefined2 *)(hd._0_8_ + 8) = 100;
    *(undefined8 *)hd._0_8_ = 0x656e696665646e55;
    *(undefined2 *)(hd._8_8_ + 8) = 100;
    *(undefined8 *)hd._8_8_ = 0x656e696665646e55;
    *(undefined2 *)(hd._16_8_ + 8) = 100;
    *(undefined8 *)hd._16_8_ = 0x656e696665646e55;
    *(undefined2 *)(hd._24_8_ + 8) = 100;
    *(undefined8 *)hd._24_8_ = 0x656e696665646e55;
    bVar33 = true;
    __src = (char *)hd._16_8_;
    puStack_198 = in_R8;
    puStack_190 = in_R9;
    if (4 < uVar11) {
      uVar31 = 4;
      iStack_19c = 0;
      do {
        uVar18 = (ulong)uVar31;
        __s2 = *(byte **)(pbVar27 + uVar18 * 8);
        fn = "-NR";
        __src = (char *)__s2;
        iVar13 = strcmp("-NR",(char *)__s2);
        piVar16 = piStack_30;
        if (iVar13 != 0) {
          bVar25 = *__s2;
          iVar14 = -(bVar25 - 0x2d);
          iVar13 = iVar14;
          if (bVar25 == 0x2d) {
            uVar20 = __s2[1] - 0x46;
            if (uVar20 == 0) {
              uVar20 = (uint)__s2[2];
            }
            if (uVar20 != 0) {
              uVar20 = __s2[1] - 0x43;
              if (uVar20 == 0) {
                uVar20 = (uint)__s2[2];
              }
              iVar13 = -uVar20;
              goto LAB_00104383;
            }
            uVar20 = uVar31 + 1;
            if ((int)uVar11 <= (int)uVar20) goto LAB_00105041;
            __isoc99_sscanf(*(undefined8 *)(pbVar27 + (ulong)uVar20 * 8),"%f",unaff_retaddr);
            __src = *(char **)(pbVar27 + (ulong)uVar20 * 8);
            fn = (char *)aiStack_d8;
            strcpy(fn,__src);
            if (*unaff_RBX != 1) {
              *unaff_RBX = 1;
              *unaff_RBP = 0;
              iVar13 = 2;
              goto LAB_00104657;
            }
LAB_00105046:
            valid_option_cold_10();
LAB_0010504b:
            valid_option_cold_7();
LAB_00105050:
            valid_option_cold_2();
          }
          else {
LAB_00104383:
            if (iVar13 == 0) {
              if ((int)(uVar31 + 3) < (int)uVar11) {
                strcpy((char *)hd._16_8_,*(char **)(pbVar27 + uVar18 * 8 + 8));
                __isoc99_sscanf(*(undefined8 *)(pbVar27 + uVar18 * 8 + 0x10),"%d",in_stack_00000028)
                ;
                fn = *(char **)(pbVar27 + (ulong)(uVar31 + 3) * 8);
                __src = "%f";
                __isoc99_sscanf(fn,"%f",in_stack_00000030);
                *(undefined4 *)CONCAT44(local_3c,local_40) = 0;
                *(undefined4 *)CONCAT44(uStack_34,local_38) = 1;
                iVar13 = 4;
                goto LAB_00104657;
              }
              valid_option_cold_8();
LAB_00105041:
              valid_option_cold_9();
              goto LAB_00105046;
            }
            iVar13 = iVar14;
            if (bVar25 == 0x2d) {
              uVar20 = __s2[1] - 0x50;
              if (uVar20 == 0) {
                uVar20 = (uint)__s2[2];
              }
              piVar16 = piStack_28;
              if (uVar20 == 0) goto LAB_001044bd;
              uVar20 = __s2[1] - 0x4c;
              if (uVar20 == 0) {
                uVar20 = (uint)__s2[2];
              }
              iVar13 = -uVar20;
            }
            if (iVar13 == 0) {
              if ((int)(uVar31 + 1) < (int)uVar11) {
                fn = *(char **)(pbVar27 + (ulong)(uVar31 + 1) * 8);
                puVar21 = puStack_48;
                goto LAB_0010464b;
              }
              goto LAB_0010504b;
            }
            iVar13 = iVar14;
            if (bVar25 == 0x2d) {
              uVar20 = __s2[1] - 0x49;
              if (uVar20 == 0) {
                uVar20 = (uint)__s2[2];
              }
              if (uVar20 == 0) {
                if ((int)(uVar31 + 1) < (int)uVar11) {
                  fn = *(char **)(pbVar27 + (ulong)(uVar31 + 1) * 8);
                  puVar21 = in_stack_00000038;
                  goto LAB_0010464b;
                }
                goto LAB_0010507d;
              }
              uVar20 = __s2[1] - 0x57;
              if (uVar20 == 0) {
                uVar20 = (uint)__s2[2];
              }
              iVar13 = -uVar20;
            }
            if (iVar13 == 0) {
              if ((int)(uVar31 + 1) < (int)uVar11) {
                fn = *(char **)(pbVar27 + (ulong)(uVar31 + 1) * 8);
                puVar21 = unaff_R15;
LAB_0010464b:
                __src = "%d";
                __isoc99_sscanf(fn,"%d",puVar21);
                iVar13 = 2;
                goto LAB_00104657;
              }
              goto LAB_00105078;
            }
            if (bVar25 == 0x2d) {
              uVar20 = __s2[1] - 0x4e;
              if (uVar20 == 0) {
                uVar20 = (uint)__s2[2];
              }
              if (uVar20 != 0) {
                uVar20 = __s2[1] - 0x42;
                if (uVar20 == 0) {
                  uVar20 = (uint)__s2[2];
                }
                iVar14 = -uVar20;
                goto LAB_0010444b;
              }
              if ((int)(uVar31 + 2) < (int)uVar11) {
                __isoc99_sscanf(*(undefined8 *)(pbVar27 + uVar18 * 8 + 8),"%d",puStack_198);
                fn = *(char **)(pbVar27 + (ulong)(uVar31 + 2) * 8);
                __src = "%d";
                __isoc99_sscanf(fn,"%d",puStack_190);
                iStack_19c = 1;
LAB_001044ab:
                iVar13 = 3;
                goto LAB_00104657;
              }
              goto LAB_00105087;
            }
LAB_0010444b:
            if (iVar14 != 0) goto LAB_00105050;
            if ((int)(uVar31 + 2) < (int)uVar11) {
              __isoc99_sscanf(*(undefined8 *)(pbVar27 + uVar18 * 8 + 8),"%d",in_stack_00000050);
              fn = *(char **)(pbVar27 + (ulong)(uVar31 + 2) * 8);
              __src = "%d";
              __isoc99_sscanf(fn,"%d",in_stack_00000048);
              *in_stack_00000040 = 1;
              goto LAB_001044ab;
            }
          }
          valid_option_cold_3();
          goto LAB_0010505a;
        }
LAB_001044bd:
        *piVar16 = 0;
        iVar13 = 1;
LAB_00104657:
        uVar31 = uVar31 + iVar13;
      } while ((int)uVar31 < (int)uVar11);
      bVar33 = iStack_19c == 0;
    }
    if (100 < *in_stack_00000028) goto LAB_00105064;
    if (4 < (int)*puStack_48) goto LAB_00105069;
    if ((7 < *unaff_R15) || ((0xa8U >> (*unaff_R15 & 0x1f) & 1) == 0)) goto LAB_00105082;
    if (bVar33) goto LAB_0010506e;
    if (*puStack_198 != *puStack_190) {
      lVar28 = *(long *)(pbVar27 + 8);
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)(lVar28 + 1 + sVar22);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "/"[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(__dest,acStack_1f8,sVar23 + 1);
      lVar28 = *(long *)(pbVar27 + 0x10);
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)(lVar28 + 1 + sVar22);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "/"[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      pvVar17 = pvStack_130;
      memcpy(pvStack_130,acStack_1f8,sVar23 + 1);
      lVar28 = *(long *)(pbVar27 + 0x18);
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)((long)__dest + sVar22 + 1);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = *(char *)((lVar28 - (int)sVar22) + sVar23);
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy((void *)hd._0_8_,acStack_1f8,sVar23 + 1);
      acStack_188[2] = 0;
      acStack_188[0] = '-';
      acStack_188[1] = 'n';
      sprintf(acStack_128,"%d",(ulong)*puStack_198);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = acStack_128[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "-"[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sprintf(acStack_128,"%d",(ulong)*puStack_190);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = acStack_128[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "-w"[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sprintf(acStack_128,"%d",(ulong)*unaff_R15);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = acStack_128[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "-l"[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sprintf(acStack_128,"%d",(ulong)*puStack_48);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = acStack_128[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "-i"[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      sprintf(acStack_128,"%d",(ulong)*in_stack_00000038);
      sVar22 = 0xffffffffffffffff;
      do {
        lVar28 = sVar22 + 1;
        acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
        sVar22 = sVar22 + 1;
      } while (acStack_188[lVar28] != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = acStack_128[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      if (*piStack_30 == 0) {
        sVar22 = 0xffffffffffffffff;
        do {
          lVar28 = sVar22 + 1;
          acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
          sVar22 = sVar22 + 1;
        } while (acStack_188[lVar28] != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = "-r"[sVar23 - (long)(int)sVar22];
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      }
      if (*piStack_28 == 0) {
        sVar22 = 0xffffffffffffffff;
        do {
          lVar28 = sVar22 + 1;
          acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
          sVar22 = sVar22 + 1;
        } while (acStack_188[lVar28] != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = "-s"[sVar23 - (long)(int)sVar22];
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      }
      if (*unaff_RBX != 0) {
        sVar22 = 0xffffffffffffffff;
        do {
          lVar28 = sVar22 + 1;
          acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
          sVar22 = sVar22 + 1;
        } while (acStack_188[lVar28] != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = "-f"[sVar23 - (long)(int)sVar22];
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy(acStack_188,acStack_1f8,sVar23 + 1);
        sVar22 = 0xffffffffffffffff;
        do {
          lVar28 = sVar22 + 1;
          acStack_1f8[sVar22 + 1] = acStack_188[lVar28];
          sVar22 = sVar22 + 1;
        } while (acStack_188[lVar28] != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = *(char *)((long)aiStack_d8 + (sVar23 - (long)(int)sVar22));
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy(acStack_188,acStack_1f8,sVar23 + 1);
      }
      lVar28 = *(long *)pbVar27;
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)((long)pvVar17 + sVar22 + 1);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = *(char *)((lVar28 - (int)sVar22) + sVar23);
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy((void *)hd._8_8_,acStack_1f8,sVar23 + 1);
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)(hd._8_8_ + 1 + sVar22);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "."[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy((void *)hd._8_8_,acStack_1f8,sVar23 + 1);
      lVar28 = *(long *)(pbVar27 + 0x18);
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)(hd._8_8_ + 1 + sVar22);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = *(char *)((lVar28 - (int)sVar22) + sVar23);
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy((void *)hd._8_8_,acStack_1f8,sVar23 + 1);
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)(hd._8_8_ + 1 + sVar22);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = "F"[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy((void *)hd._8_8_,acStack_1f8,sVar23 + 1);
      sVar22 = 0xffffffffffffffff;
      do {
        cVar4 = *(char *)(hd._8_8_ + 1 + sVar22);
        acStack_1f8[sVar22 + 1] = cVar4;
        sVar22 = sVar22 + 1;
      } while (cVar4 != '\0');
      sVar10 = sVar22;
      do {
        sVar23 = sVar10;
        cVar4 = acStack_188[sVar23 - (long)(int)sVar22];
        acStack_1f8[sVar23] = cVar4;
        sVar10 = sVar23 + 1;
      } while (cVar4 != '\0');
      acStack_1f8[sVar23] = '\0';
      memcpy((void *)hd._8_8_,acStack_1f8,sVar23 + 1);
      if (*(int *)CONCAT44(uStack_34,local_38) != 0) {
        lVar28 = *(long *)pbVar27;
        sVar22 = 0xffffffffffffffff;
        do {
          cVar4 = *(char *)((long)pvVar17 + sVar22 + 1);
          acStack_1f8[sVar22 + 1] = cVar4;
          sVar22 = sVar22 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = *(char *)((lVar28 - (int)sVar22) + sVar23);
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy((void *)hd._24_8_,acStack_1f8,sVar23 + 1);
        sVar22 = 0xffffffffffffffff;
        do {
          cVar4 = *(char *)(hd._24_8_ + 1 + sVar22);
          acStack_1f8[sVar22 + 1] = cVar4;
          sVar22 = sVar22 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = "."[sVar23 - (long)(int)sVar22];
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy((void *)hd._24_8_,acStack_1f8,sVar23 + 1);
        lVar28 = *(long *)(pbVar27 + 0x18);
        sVar22 = 0xffffffffffffffff;
        do {
          cVar4 = *(char *)(hd._24_8_ + 1 + sVar22);
          acStack_1f8[sVar22 + 1] = cVar4;
          sVar22 = sVar22 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = *(char *)((lVar28 - (int)sVar22) + sVar23);
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy((void *)hd._24_8_,acStack_1f8,sVar23 + 1);
        sVar22 = 0xffffffffffffffff;
        do {
          cVar4 = *(char *)(hd._24_8_ + 1 + sVar22);
          acStack_1f8[sVar22 + 1] = cVar4;
          sVar22 = sVar22 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = "H"[sVar23 - (long)(int)sVar22];
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy((void *)hd._24_8_,acStack_1f8,sVar23 + 1);
        sVar22 = 0xffffffffffffffff;
        do {
          cVar4 = *(char *)(hd._24_8_ + 1 + sVar22);
          acStack_1f8[sVar22 + 1] = cVar4;
          sVar22 = sVar22 + 1;
        } while (cVar4 != '\0');
        sVar10 = sVar22;
        do {
          sVar23 = sVar10;
          cVar4 = acStack_188[sVar23 - (long)(int)sVar22];
          acStack_1f8[sVar23] = cVar4;
          sVar10 = sVar23 + 1;
        } while (cVar4 != '\0');
        acStack_1f8[sVar23] = '\0';
        memcpy((void *)hd._24_8_,acStack_1f8,sVar23 + 1);
      }
      printf(" Generated velocity filename  : %s\n",hd._8_8_);
      printf(" Generated histogram filename : %s\n",hd._24_8_);
      printf(" Input stem name              : %s\n",hd._0_8_);
      printf(" Correct velocity filename    : %s\n",hd._16_8_);
      fflush(_stdout);
      return;
    }
  }
  else {
    valid_option_cold_1();
    __src = (char *)pbVar27;
LAB_00105064:
    valid_option_cold_15();
LAB_00105069:
    valid_option_cold_14();
LAB_0010506e:
    valid_option_cold_12();
  }
  valid_option_cold_11();
LAB_00105078:
  valid_option_cold_5();
LAB_0010507d:
  valid_option_cold_6();
LAB_00105082:
  valid_option_cold_13();
LAB_00105087:
  valid_option_cold_4();
  if ((*(int *)fn == *(int *)((long)fn + 4)) && (*(int *)__src == *(int *)((byte *)__src + 4))) {
    return;
  }
  valid_size_cold_1();
  iVar13 = *(int *)fn;
  iVar14 = *(int *)((long)fn + 4);
  iVar26 = *(int *)((long)fn + 8);
  p = (qnode_ptr_t)malloc(0x40);
  p->res = iVar13;
  p->sizx = iVar14;
  p->sizy = iVar26;
  iVar24 = 0;
  p->level = 0;
  p_00 = (qnode_ptr_t)malloc(0x40);
  p_00->res = iVar13;
  p_00->sizx = iVar14;
  p_00->sizy = iVar26;
  p_00->level = 0;
  alloc_flow(p);
  alloc_flow(p_00);
  iVar13 = *(int *)((long)fn + 8);
  if (0 < iVar13) {
    uVar18 = (ulong)*(uint *)((long)fn + 4);
    do {
      if (0 < (int)uVar18) {
        iVar13 = p_00->res;
        padVar6 = p_00->flow_ptr;
        lVar28 = 0;
        do {
          (*padVar6)[(long)iVar13 * (long)iVar24 + lVar28] =
               *(disp_vect_t *)
                (*(long *)((long)fn + 0x28) + ((long)*(int *)fn * (long)iVar24 + lVar28) * 8);
          lVar28 = lVar28 + 1;
          uVar18 = (ulong)*(int *)((long)fn + 4);
        } while (lVar28 < (long)uVar18);
        iVar13 = *(int *)((long)fn + 8);
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 < iVar13);
  }
  if (0 < extraout_EDX) {
    iVar14 = 0;
    do {
      if (0 < iVar13) {
        uVar11 = *(uint *)((long)fn + 4);
        iVar26 = -1;
        iStack_2fc = 1;
        iVar24 = 0;
        do {
          iVar30 = iVar24 + 1;
          if (0 < (int)uVar11) {
            iVar5 = p->res;
            padVar6 = p->flow_ptr;
            uVar18 = 0;
            do {
              if (iVar13 <= iVar30) {
                auVar43 = ZEXT816(0);
              }
              else {
                dVar3 = (*p_00->flow_ptr)[(long)p_00->res * (long)iStack_2fc + uVar18];
                auVar43._0_4_ = dVar3.x + 0.0;
                auVar43._4_4_ = dVar3.y + 0.0;
                auVar43._8_8_ = 0;
              }
              bVar25 = iVar13 > iVar30;
              auVar40 = auVar43;
              if (iVar24 != 0) {
                dVar3 = (*p_00->flow_ptr)[(long)p_00->res * (long)iVar26 + uVar18];
                auVar40._0_4_ = auVar43._0_4_ + dVar3.x;
                auVar40._4_4_ = auVar43._4_4_ + dVar3.y;
                auVar40._8_4_ = auVar43._8_4_ + 0.0;
                auVar40._12_4_ = auVar43._12_4_ + 0.0;
                bVar25 = bVar25 + 1;
              }
              uVar1 = uVar18 + 1;
              auVar41 = auVar40;
              if ((long)uVar1 < (long)(int)uVar11) {
                dVar3 = (*p_00->flow_ptr)[p_00->res * iVar24 + (int)uVar18 + 1];
                auVar41._0_4_ = auVar40._0_4_ + dVar3.x;
                auVar41._4_4_ = auVar40._4_4_ + dVar3.y;
                auVar41._8_4_ = auVar40._8_4_ + 0.0;
                auVar41._12_4_ = auVar40._12_4_ + 0.0;
                bVar25 = bVar25 + 1;
              }
              auVar42 = auVar41;
              if (uVar18 != 0) {
                dVar3 = (*p_00->flow_ptr)[p_00->res * iVar24 + (int)uVar18 + -1];
                auVar42._0_4_ = auVar41._0_4_ + dVar3.x;
                auVar42._4_4_ = auVar41._4_4_ + dVar3.y;
                auVar42._8_4_ = auVar41._8_4_ + 0.0;
                auVar42._12_4_ = auVar41._12_4_ + 0.0;
                bVar25 = bVar25 + 1;
              }
              auVar9._4_4_ = (float)bVar25;
              auVar9._0_4_ = (float)bVar25;
              auVar9._8_8_ = 0;
              auVar43 = divps(auVar42,auVar9);
              (*padVar6)[(long)(iVar5 * iVar24) + uVar18] = auVar43._0_8_;
              uVar18 = uVar1;
            } while (uVar11 != uVar1);
          }
          iVar26 = iVar26 + 1;
          iStack_2fc = iStack_2fc + 1;
          iVar24 = iVar30;
        } while (iVar30 != iVar13);
        if (0 < iVar13) {
          uVar18 = (ulong)*(uint *)((long)fn + 4);
          iVar26 = 0;
          do {
            if (0 < (int)uVar18) {
              iVar13 = p_00->res;
              padVar6 = p_00->flow_ptr;
              iVar24 = p->res;
              padVar7 = p->flow_ptr;
              lVar28 = 0;
              do {
                lVar8 = *(long *)((byte *)__src + 0x20);
                lVar32 = (long)iVar26;
                lVar19 = *(int *)__src * lVar32 + lVar28;
                fVar46 = *(float *)(lVar8 + 8 + lVar19 * 0xc);
                fVar2 = *(float *)(lVar8 + 4 + lVar19 * 0xc);
                lVar29 = *(int *)fn * lVar32 + lVar28;
                fVar49 = *(float *)(*(long *)((long)fn + 0x28) + lVar29 * 8);
                fVar47 = *(float *)(*(long *)((long)fn + 0x28) + 4 + lVar29 * 8);
                dVar39 = (double)-*(float *)(lVar8 + lVar19 * 0xc);
                dVar3 = (*padVar7)[iVar24 * iVar26 + lVar28];
                dVar36 = cos(dVar39);
                dVar37 = sin(dVar39);
                dVar38 = sin(dVar39);
                dVar39 = cos(dVar39);
                fVar34 = (float)(dVar37 * 0.0 + dVar36);
                fVar44 = (float)(dVar39 * 0.0 - dVar38);
                dVar39 = (double)-*(float *)(*(long *)((byte *)__src + 0x20) +
                                            (*(int *)__src * lVar32 + lVar28) * 0xc);
                dVar36 = cos(dVar39);
                dVar37 = sin(dVar39);
                dVar38 = sin(dVar39);
                dVar39 = cos(dVar39);
                fVar35 = (float)(dVar37 + dVar36 * 0.0);
                fVar45 = (float)(dVar39 + dVar38 * -0.0);
                fStack_268 = dVar3.x;
                fStack_264 = dVar3.y;
                fVar49 = fVar49 - fStack_268;
                fVar47 = fVar47 - fStack_264;
                fVar48 = (fVar49 * fVar35 + fVar45 * fVar47) * (fVar46 / (fVar46 + 1.0));
                fVar46 = (fVar49 * fVar34 + fVar44 * fVar47) * (fVar2 / (fVar2 + 1.0));
                dVar3.y = fVar46 * fVar44 + fVar48 * fVar45 + fStack_264;
                dVar3.x = fVar46 * fVar34 + fVar48 * fVar35 + fStack_268;
                (*padVar6)[iVar13 * iVar26 + lVar28] = dVar3;
                lVar28 = lVar28 + 1;
                uVar18 = (ulong)*(int *)((long)fn + 4);
              } while (lVar28 < (long)uVar18);
              iVar13 = *(int *)((long)fn + 8);
            }
            iVar26 = iVar26 + 1;
          } while (iVar26 < iVar13);
        }
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != extraout_EDX);
  }
  if (0 < iVar13) {
    uVar18 = (ulong)*(uint *)((long)fn + 4);
    iVar14 = 0;
    do {
      if (0 < (int)uVar18) {
        iVar13 = p_00->res;
        padVar6 = p_00->flow_ptr;
        lVar28 = 0;
        do {
          *(disp_vect_t *)
           (*(long *)((long)fn + 0x28) + ((long)*(int *)fn * (long)iVar14 + lVar28) * 8) =
               (*padVar6)[(long)iVar13 * (long)iVar14 + lVar28];
          lVar28 = lVar28 + 1;
          uVar18 = (ulong)*(int *)((long)fn + 4);
        } while (lVar28 < (long)uVar18);
        iVar13 = *(int *)((long)fn + 8);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < iVar13);
  }
  dealloc_flow(p);
  dealloc_flow(p_00);
  free(p);
  free(p_00);
  return;
}

Assistant:

void raster_size(fn,x,y,a)
char *fn ;
int *x, *y, *a ;

{ raster_t hd ;
  int fd, max ;

  if ((fd = open(fn,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > *y) {
        max = *x ;
      }
      else {
        max = *y ;
      }
      if (max <= N1 && max > N2) {
        *a = N1 ;
      }
      else if (max <= N2 && max > N3) {
        *a = N2 ;
      }
      else if (max <= N3 && max > N4) {
        *a = N3 ;
      }
      else {
        error(14) ;
      }
    }
    else {
      error(6) ;
    }
  }
  else {
    error(7) ;
  }
  close(fd) ;
}